

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void __thiscall DCanvas::GetBlock(DCanvas *this,int x,int y,int _width,int _height,BYTE *dest)

{
  BYTE *local_30;
  BYTE *src;
  BYTE *dest_local;
  int _height_local;
  int _width_local;
  int y_local;
  int x_local;
  DCanvas *this_local;
  
  if ((((x < 0) || (this->Width < x + _width)) || (y < 0)) || (this->Height < y + _height)) {
    I_Error("Bad V_GetBlock");
  }
  local_30 = this->Buffer + (long)x + (long)(y * this->Pitch);
  src = dest;
  dest_local._0_4_ = _height;
  while ((int)dest_local != 0) {
    memcpy(src,local_30,(long)_width);
    local_30 = local_30 + this->Pitch;
    src = src + _width;
    dest_local._0_4_ = (int)dest_local + -1;
  }
  return;
}

Assistant:

void DCanvas::GetBlock (int x, int y, int _width, int _height, BYTE *dest) const
{
	const BYTE *src;

#ifdef RANGECHECK 
	if (x<0
		||x+_width > Width
		|| y<0
		|| y+_height>Height)
	{
		I_Error ("Bad V_GetBlock");
	}
#endif

	src = Buffer + y*Pitch + x;

	while (_height--)
	{
		memcpy (dest, src, _width);
		src += Pitch;
		dest += _width;
	}
}